

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_mod.cpp
# Opt level: O0

void Commands::SetX(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Command_Source *from,string *set)

{
  AdminLevel AVar1;
  World *pWVar2;
  ulong uVar3;
  string *psVar4;
  byte bVar5;
  bool bVar6;
  AdminLevel AVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  const_reference pvVar10;
  Character *pCVar11;
  long lVar12;
  size_type sVar13;
  AdminLevel *pAVar14;
  Character *pCVar15;
  mapped_type *pmVar16;
  int *piVar17;
  uint local_bfc;
  byte local_a49;
  undefined1 local_678 [8];
  PacketBuilder builder_2;
  PacketBuilder builder_1;
  PacketBuilder builder;
  string local_5e0;
  string local_5c0;
  int local_5a0 [3];
  int local_594 [3];
  int local_588 [3];
  allocator<char> local_579;
  key_type local_578;
  int local_558 [3];
  allocator<char> local_549;
  key_type local_548;
  int local_528 [3];
  allocator<char> local_519;
  key_type local_518;
  int local_4f4 [3];
  int local_4e8 [3];
  byte local_4da;
  allocator<char> local_4d9;
  string local_4d8 [38];
  byte local_4b2;
  allocator<char> local_4b1;
  string local_4b0 [38];
  byte local_48a;
  allocator<char> local_489;
  string local_488 [39];
  allocator<char> local_461;
  string local_460;
  string local_440;
  byte local_41e;
  AdminLevel local_41d [3];
  AdminLevel local_41a;
  allocator<char> local_419;
  undefined1 local_418 [2];
  bool would_privilege;
  AdminLevel level_1;
  int local_3f8;
  allocator<char> local_3f1;
  int hide_level;
  int local_3d0;
  allocator<char> local_3c9;
  int no_interact_default;
  int local_3a8;
  allocator<char> local_3a1;
  int no_interact_default_admin;
  allocator<char> local_379;
  key_type local_378;
  int local_358 [3];
  allocator<char> local_349;
  key_type local_348;
  allocator<char> local_321;
  key_type local_320;
  int local_300 [3];
  allocator<char> local_2f1;
  key_type local_2f0;
  int local_2d0 [3];
  allocator<char> local_2c1;
  key_type local_2c0;
  int local_2a0 [3];
  allocator<char> local_291;
  key_type local_290;
  int local_270 [3];
  allocator<char> local_261;
  key_type local_260;
  int local_240 [3];
  allocator<char> local_231;
  key_type local_230;
  int local_210 [3];
  allocator<char> local_201;
  key_type local_200;
  int local_1e0 [3];
  allocator<char> local_1d1;
  key_type local_1d0;
  int local_1b0 [3];
  allocator<char> local_1a1;
  key_type local_1a0;
  int local_17c [3];
  byte local_16f;
  byte local_16e;
  byte local_16d;
  byte local_16c;
  byte local_16b;
  byte local_16a;
  byte local_169;
  bool skillpoints;
  bool statpoints;
  bool karma;
  bool stats;
  bool level;
  bool failure;
  ulong uStack_168;
  bool appearance;
  size_t i;
  string local_158 [8];
  string title_string;
  string local_130;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  Character *local_60;
  Character *from_character;
  string local_48;
  Character *local_28;
  Character *victim;
  string *set_local;
  Command_Source *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  victim = (Character *)set;
  set_local = (string *)from;
  from_local = (Command_Source *)arguments;
  iVar8 = (*from->_vptr_Command_Source[4])();
  pvVar10 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)from_local,0);
  std::__cxx11::string::string((string *)&local_48,(string *)pvVar10);
  pCVar11 = World::GetCharacter((World *)CONCAT44(extraout_var,iVar8),&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  local_28 = pCVar11;
  local_60 = (Character *)(**(code **)(*(long *)set_local + 0x18))();
  psVar4 = set_local;
  if ((local_28 == (Character *)0x0) || ((local_28->nowhere & 1U) != 0)) {
    lVar12 = (**(code **)(*(long *)set_local + 0x20))();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"character_not_found",&local_a1);
    I18N::Format<>(&local_80,(I18N *)(lVar12 + 0x490),&local_a0);
    (**(code **)(*(long *)psVar4 + 0x28))(psVar4,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  else {
    uVar9 = (**(local_28->super_Command_Source)._vptr_Command_Source)();
    bVar5 = (*(code *)**(undefined8 **)set_local)();
    psVar4 = set_local;
    if (((uVar9 & 0xff) < (uint)bVar5) || (local_28 == local_60)) {
      if ((local_60 == (Character *)0x0) ||
         ((local_60 == local_28 ||
          (bVar6 = Character::CanInteractCharMod(local_60), psVar4 = set_local, bVar6)))) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_158,"",(allocator<char> *)((long)&i + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
        for (uStack_168 = 1; uVar3 = uStack_168,
            sVar13 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)from_local), uVar3 < sVar13; uStack_168 = uStack_168 + 1) {
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)from_local,uStack_168);
          std::__cxx11::string::operator+=(local_158,(string *)pvVar10);
          uVar3 = uStack_168;
          sVar13 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)from_local);
          if (uVar3 < sVar13 - 1) {
            std::__cxx11::string::operator+=(local_158," ");
          }
        }
        local_169 = 0;
        local_16a = 0;
        local_16b = 0;
        local_16c = 0;
        local_16d = 0;
        local_16e = 0;
        local_16f = 0;
        bVar6 = std::operator==(set,"level");
        if (bVar6) {
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)from_local,1);
          local_17c[2] = util::to_int(pvVar10);
          local_17c[1] = 0;
          piVar17 = std::max<int>(local_17c + 2,local_17c + 1);
          lVar12 = (**(code **)(*(long *)set_local + 0x20))();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a0,"MaxLevel",&local_1a1);
          pmVar16 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                  *)(lVar12 + 0x198),&local_1a0);
          local_17c[0] = util::variant::operator_cast_to_int(pmVar16);
          piVar17 = std::min<int>(piVar17,local_17c);
          local_16b = 1;
          local_28->level = (uchar)*piVar17;
          std::__cxx11::string::~string((string *)&local_1a0);
          std::allocator<char>::~allocator(&local_1a1);
        }
        else {
          bVar6 = std::operator==(set,"exp");
          if (bVar6) {
            pvVar10 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)from_local,1);
            local_1b0[2] = util::to_int(pvVar10);
            local_1b0[1] = 0;
            piVar17 = std::max<int>(local_1b0 + 2,local_1b0 + 1);
            lVar12 = (**(code **)(*(long *)set_local + 0x20))();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d0,"MaxExp",&local_1d1);
            pmVar16 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                      ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                    *)(lVar12 + 0x198),&local_1d0);
            local_1b0[0] = util::variant::operator_cast_to_int(pmVar16);
            piVar17 = std::min<int>(piVar17,local_1b0);
            local_16b = 1;
            local_28->exp = *piVar17;
            std::__cxx11::string::~string((string *)&local_1d0);
            std::allocator<char>::~allocator(&local_1d1);
          }
          else {
            bVar6 = std::operator==(set,"str");
            if (bVar6) {
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)from_local,1);
              local_1e0[2] = util::to_int(pvVar10);
              local_1e0[1] = 0;
              piVar17 = std::max<int>(local_1e0 + 2,local_1e0 + 1);
              lVar12 = (**(code **)(*(long *)set_local + 0x20))();
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_200,"MaxStat",&local_201);
              pmVar16 = std::
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                      *)(lVar12 + 0x198),&local_200);
              local_1e0[0] = util::variant::operator_cast_to_int(pmVar16);
              piVar17 = std::min<int>(piVar17,local_1e0);
              local_16c = 1;
              local_28->str = *piVar17;
              std::__cxx11::string::~string((string *)&local_200);
              std::allocator<char>::~allocator(&local_201);
            }
            else {
              bVar6 = std::operator==(set,"int");
              if (bVar6) {
                pvVar10 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)from_local,1);
                local_210[2] = util::to_int(pvVar10);
                local_210[1] = 0;
                piVar17 = std::max<int>(local_210 + 2,local_210 + 1);
                lVar12 = (**(code **)(*(long *)set_local + 0x20))();
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_230,"MaxStat",&local_231);
                pmVar16 = std::
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                        *)(lVar12 + 0x198),&local_230);
                local_210[0] = util::variant::operator_cast_to_int(pmVar16);
                piVar17 = std::min<int>(piVar17,local_210);
                local_16c = 1;
                local_28->intl = *piVar17;
                std::__cxx11::string::~string((string *)&local_230);
                std::allocator<char>::~allocator(&local_231);
              }
              else {
                bVar6 = std::operator==(set,"wis");
                if (bVar6) {
                  pvVar10 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)from_local,1);
                  local_240[2] = util::to_int(pvVar10);
                  local_240[1] = 0;
                  piVar17 = std::max<int>(local_240 + 2,local_240 + 1);
                  lVar12 = (**(code **)(*(long *)set_local + 0x20))();
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_260,"MaxStat",&local_261);
                  pmVar16 = std::
                            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                          *)(lVar12 + 0x198),&local_260);
                  local_240[0] = util::variant::operator_cast_to_int(pmVar16);
                  piVar17 = std::min<int>(piVar17,local_240);
                  local_16c = 1;
                  local_28->wis = *piVar17;
                  std::__cxx11::string::~string((string *)&local_260);
                  std::allocator<char>::~allocator(&local_261);
                }
                else {
                  bVar6 = std::operator==(set,"agi");
                  if (bVar6) {
                    pvVar10 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)from_local,1);
                    local_270[2] = util::to_int(pvVar10);
                    local_270[1] = 0;
                    piVar17 = std::max<int>(local_270 + 2,local_270 + 1);
                    lVar12 = (**(code **)(*(long *)set_local + 0x20))();
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_290,"MaxStat",&local_291);
                    pmVar16 = std::
                              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                            *)(lVar12 + 0x198),&local_290);
                    local_270[0] = util::variant::operator_cast_to_int(pmVar16);
                    piVar17 = std::min<int>(piVar17,local_270);
                    local_16c = 1;
                    local_28->agi = *piVar17;
                    std::__cxx11::string::~string((string *)&local_290);
                    std::allocator<char>::~allocator(&local_291);
                  }
                  else {
                    bVar6 = std::operator==(set,"con");
                    if (bVar6) {
                      pvVar10 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)from_local,1);
                      local_2a0[2] = util::to_int(pvVar10);
                      local_2a0[1] = 0;
                      piVar17 = std::max<int>(local_2a0 + 2,local_2a0 + 1);
                      lVar12 = (**(code **)(*(long *)set_local + 0x20))();
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_2c0,"MaxStat",&local_2c1);
                      pmVar16 = std::
                                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                              *)(lVar12 + 0x198),&local_2c0);
                      local_2a0[0] = util::variant::operator_cast_to_int(pmVar16);
                      piVar17 = std::min<int>(piVar17,local_2a0);
                      local_16c = 1;
                      local_28->con = *piVar17;
                      std::__cxx11::string::~string((string *)&local_2c0);
                      std::allocator<char>::~allocator(&local_2c1);
                    }
                    else {
                      bVar6 = std::operator==(set,"cha");
                      if (bVar6) {
                        pvVar10 = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)from_local,1);
                        local_2d0[2] = util::to_int(pvVar10);
                        local_2d0[1] = 0;
                        piVar17 = std::max<int>(local_2d0 + 2,local_2d0 + 1);
                        lVar12 = (**(code **)(*(long *)set_local + 0x20))();
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_2f0,"MaxStat",&local_2f1);
                        pmVar16 = std::
                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                *)(lVar12 + 0x198),&local_2f0);
                        local_2d0[0] = util::variant::operator_cast_to_int(pmVar16);
                        piVar17 = std::min<int>(piVar17,local_2d0);
                        local_16c = 1;
                        local_28->cha = *piVar17;
                        std::__cxx11::string::~string((string *)&local_2f0);
                        std::allocator<char>::~allocator(&local_2f1);
                      }
                      else {
                        bVar6 = std::operator==(set,"statpoints");
                        if (bVar6) {
                          pvVar10 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local,1);
                          local_300[2] = util::to_int(pvVar10);
                          local_300[1] = 0;
                          piVar17 = std::max<int>(local_300 + 2,local_300 + 1);
                          lVar12 = (**(code **)(*(long *)set_local + 0x20))();
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_320,"MaxLevel",&local_321);
                          pmVar16 = std::
                                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  *)(lVar12 + 0x198),&local_320);
                          iVar8 = util::variant::operator_cast_to_int(pmVar16);
                          lVar12 = (**(code **)(*(long *)set_local + 0x20))();
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_348,"StatPerLevel",&local_349);
                          pmVar16 = std::
                                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  *)(lVar12 + 0x198),&local_348);
                          local_300[0] = util::variant::operator_cast_to_int(pmVar16);
                          local_300[0] = iVar8 * local_300[0];
                          piVar17 = std::min<int>(piVar17,local_300);
                          local_16e = 1;
                          local_28->statpoints = *piVar17;
                          std::__cxx11::string::~string((string *)&local_348);
                          std::allocator<char>::~allocator(&local_349);
                          std::__cxx11::string::~string((string *)&local_320);
                          std::allocator<char>::~allocator(&local_321);
                        }
                        else {
                          bVar6 = std::operator==(set,"skillpoints");
                          if (bVar6) {
                            pvVar10 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local,1);
                            local_358[2] = util::to_int(pvVar10);
                            local_358[1] = 0;
                            piVar17 = std::max<int>(local_358 + 2,local_358 + 1);
                            lVar12 = (**(code **)(*(long *)set_local + 0x20))();
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_378,"MaxLevel",&local_379);
                            pmVar16 = std::
                                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                      ::operator[]((
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  *)(lVar12 + 0x198),&local_378);
                            iVar8 = util::variant::operator_cast_to_int(pmVar16);
                            lVar12 = (**(code **)(*(long *)set_local + 0x20))();
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&no_interact_default_admin,"SkillPerLevel",
                                       &local_3a1);
                            pmVar16 = std::
                                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                      ::operator[]((
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  *)(lVar12 + 0x198),
                                                  (key_type *)&no_interact_default_admin);
                            local_358[0] = util::variant::operator_cast_to_int(pmVar16);
                            local_358[0] = iVar8 * local_358[0];
                            piVar17 = std::min<int>(piVar17,local_358);
                            local_16f = 1;
                            local_28->skillpoints = *piVar17;
                            std::__cxx11::string::~string((string *)&no_interact_default_admin);
                            std::allocator<char>::~allocator(&local_3a1);
                            std::__cxx11::string::~string((string *)&local_378);
                            std::allocator<char>::~allocator(&local_379);
                          }
                          else {
                            bVar6 = std::operator==(set,"admin");
                            if (bVar6) {
                              pWVar2 = local_28->world;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&no_interact_default,"NoInteractDefaultAdmin",
                                         &local_3c9);
                              pmVar16 = std::
                                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                        ::operator[](&(pWVar2->config).
                                                                                                            
                                                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ,(key_type *)&no_interact_default);
                              iVar8 = util::variant::operator_cast_to_int(pmVar16);
                              std::__cxx11::string::~string((string *)&no_interact_default);
                              std::allocator<char>::~allocator(&local_3c9);
                              pWVar2 = local_28->world;
                              local_3a8 = iVar8;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&hide_level,"NoInteractDefault",&local_3f1);
                              pmVar16 = std::
                                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                        ::operator[](&(pWVar2->config).
                                                                                                            
                                                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ,(key_type *)&hide_level);
                              iVar8 = util::variant::operator_cast_to_int(pmVar16);
                              std::__cxx11::string::~string((string *)&hide_level);
                              std::allocator<char>::~allocator(&local_3f1);
                              pWVar2 = local_28->world;
                              local_3d0 = iVar8;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)local_418,"hide",&local_419);
                              pmVar16 = std::
                                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                        ::operator[](&(pWVar2->admin_config).
                                                                                                            
                                                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ,(key_type *)local_418);
                              iVar8 = util::variant::operator_cast_to_int(pmVar16);
                              std::__cxx11::string::~string((string *)local_418);
                              std::allocator<char>::~allocator(&local_419);
                              local_3f8 = iVar8;
                              pvVar10 = std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local,1);
                              iVar8 = util::to_int(pvVar10);
                              local_41d[2] = (AdminLevel)iVar8;
                              local_41d[1] = 0;
                              pAVar14 = std::max<AdminLevel>(local_41d + 2,local_41d + 1);
                              local_41d[0] = ADMIN_HGM;
                              pAVar14 = std::min<AdminLevel>(pAVar14,local_41d);
                              AVar1 = *pAVar14;
                              local_a49 = 0;
                              if (((local_3d0 != 0) &&
                                  (local_a49 = 0, local_3a8 <= (int)(uint)local_28->admin)) &&
                                 (local_a49 = 0, (int)(uint)AVar1 < local_3a8)) {
                                local_a49 = (local_28->nointeract & 1U) != 0 ^ 0xff;
                              }
                              local_41e = local_a49 & 1;
                              local_41a = AVar1;
                              AVar7 = (*(code *)**(undefined8 **)set_local)();
                              pCVar11 = local_28;
                              if (((AVar1 < AVar7) &&
                                  (pCVar15 = (Character *)(**(code **)(*(long *)set_local + 0x18))()
                                  , pCVar11 != pCVar15)) && ((local_41e & 1) == 0)) {
                                if ((((int)(uint)local_28->admin < local_3a8) &&
                                    (local_3a8 <= (int)(uint)local_41a)) &&
                                   ((local_28->nointeract & 1U) == 0)) {
                                  local_28->nointeract = local_3d0;
                                }
                                if ((local_3f8 <= (int)(uint)local_28->admin) &&
                                   ((int)(uint)local_41a < local_3f8)) {
                                  Character::Unhide(local_28,0x1f);
                                }
                                if ((local_41a == ADMIN_PLAYER) && (local_28->admin != ADMIN_PLAYER)
                                   ) {
                                  World::DecAdminCount(local_28->world);
                                }
                                else if ((local_41a != ADMIN_PLAYER) &&
                                        (local_28->admin == ADMIN_PLAYER)) {
                                  World::IncAdminCount(local_28->world);
                                }
                                local_28->admin = local_41a;
                              }
                              else {
                                psVar4 = set_local;
                                lVar12 = (**(code **)(*(long *)set_local + 0x20))();
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_460,"command_access_denied",&local_461);
                                I18N::Format<>(&local_440,(I18N *)(lVar12 + 0x490),&local_460);
                                (**(code **)(*(long *)psVar4 + 0x28))(psVar4,&local_440);
                                std::__cxx11::string::~string((string *)&local_440);
                                std::__cxx11::string::~string((string *)&local_460);
                                std::allocator<char>::~allocator(&local_461);
                              }
                            }
                            else {
                              bVar6 = std::operator==(set,"title");
                              if (bVar6) {
                                std::__cxx11::string::operator=
                                          ((string *)&local_28->title,local_158);
                              }
                              else {
                                bVar6 = std::operator==(set,"fiance");
                                if (bVar6) {
                                  sVar13 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::size((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local);
                                  local_48a = 0;
                                  if (sVar13 < 2) {
                                    std::allocator<char>::allocator();
                                    local_48a = 1;
                                    std::__cxx11::string::string<std::allocator<char>>
                                              (local_488,"",&local_489);
                                  }
                                  else {
                                    pvVar10 = std::
                                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local,1);
                                    std::__cxx11::string::string(local_488,(string *)pvVar10);
                                  }
                                  std::__cxx11::string::operator=
                                            ((string *)&local_28->fiance,local_488);
                                  std::__cxx11::string::~string(local_488);
                                  if ((local_48a & 1) != 0) {
                                    std::allocator<char>::~allocator(&local_489);
                                  }
                                }
                                else {
                                  bVar6 = std::operator==(set,"partner");
                                  if (bVar6) {
                                    sVar13 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::size((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local);
                                    local_4b2 = 0;
                                    if (sVar13 < 2) {
                                      std::allocator<char>::allocator();
                                      local_4b2 = 1;
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (local_4b0,"",&local_4b1);
                                    }
                                    else {
                                      pvVar10 = std::
                                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local,1);
                                      std::__cxx11::string::string(local_4b0,(string *)pvVar10);
                                    }
                                    std::__cxx11::string::operator=
                                              ((string *)&local_28->partner,local_4b0);
                                    std::__cxx11::string::~string(local_4b0);
                                    if ((local_4b2 & 1) != 0) {
                                      std::allocator<char>::~allocator(&local_4b1);
                                    }
                                  }
                                  else {
                                    bVar6 = std::operator==(set,"home");
                                    if (bVar6) {
                                      sVar13 = std::
                                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ::size((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local);
                                      local_4da = 0;
                                      if (sVar13 < 2) {
                                        std::allocator<char>::allocator();
                                        local_4da = 1;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (local_4d8,"",&local_4d9);
                                      }
                                      else {
                                        pvVar10 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local,1);
                                        std::__cxx11::string::string(local_4d8,(string *)pvVar10);
                                      }
                                      std::__cxx11::string::operator=
                                                ((string *)&local_28->home,local_4d8);
                                      std::__cxx11::string::~string(local_4d8);
                                      if ((local_4da & 1) != 0) {
                                        std::allocator<char>::~allocator(&local_4d9);
                                      }
                                    }
                                    else {
                                      bVar6 = std::operator==(set,"gender");
                                      if (bVar6) {
                                        pvVar10 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local,1);
                                        local_4e8[2] = util::to_int(pvVar10);
                                        local_4e8[1] = 0;
                                        piVar17 = std::max<int>(local_4e8 + 2,local_4e8 + 1);
                                        local_4e8[0] = 1;
                                        piVar17 = std::min<int>(piVar17,local_4e8);
                                        local_169 = 1;
                                        local_28->gender = (Gender)*piVar17;
                                      }
                                      else {
                                        bVar6 = std::operator==(set,"hairstyle");
                                        if (bVar6) {
                                          pvVar10 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local,1);
                                          local_4f4[2] = util::to_int(pvVar10);
                                          local_4f4[1] = 0;
                                          piVar17 = std::max<int>(local_4f4 + 2,local_4f4 + 1);
                                          lVar12 = (**(code **)(*(long *)set_local + 0x20))();
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_518,"MaxHairStyle",&local_519)
                                          ;
                                          pmVar16 = std::
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ::operator[]((
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  *)(lVar12 + 0x198),&local_518);
                                          local_4f4[0] = util::variant::operator_cast_to_int
                                                                   (pmVar16);
                                          piVar17 = std::min<int>(piVar17,local_4f4);
                                          local_169 = 1;
                                          local_28->hairstyle = (uchar)*piVar17;
                                          std::__cxx11::string::~string((string *)&local_518);
                                          std::allocator<char>::~allocator(&local_519);
                                        }
                                        else {
                                          bVar6 = std::operator==(set,"haircolor");
                                          if (bVar6) {
                                            pvVar10 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local,1);
                                            local_528[2] = util::to_int(pvVar10);
                                            local_528[1] = 0;
                                            piVar17 = std::max<int>(local_528 + 2,local_528 + 1);
                                            lVar12 = (**(code **)(*(long *)set_local + 0x20))();
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_548,"MaxHairColor",
                                                       &local_549);
                                            pmVar16 = std::
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ::operator[]((
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  *)(lVar12 + 0x198),&local_548);
                                            local_528[0] = util::variant::operator_cast_to_int
                                                                     (pmVar16);
                                            piVar17 = std::min<int>(piVar17,local_528);
                                            local_169 = 1;
                                            local_28->haircolor = (uchar)*piVar17;
                                            std::__cxx11::string::~string((string *)&local_548);
                                            std::allocator<char>::~allocator(&local_549);
                                          }
                                          else {
                                            bVar6 = std::operator==(set,"race");
                                            if (bVar6) {
                                              pvVar10 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local,1);
                                              local_558[2] = util::to_int(pvVar10);
                                              local_558[1] = 0;
                                              piVar17 = std::max<int>(local_558 + 2,local_558 + 1);
                                              lVar12 = (**(code **)(*(long *)set_local + 0x20))();
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_578,"MaxSkin",&local_579);
                                              pmVar16 = std::
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ::operator[]((
                                                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  *)(lVar12 + 0x198),&local_578);
                                              local_558[0] = util::variant::operator_cast_to_int
                                                                       (pmVar16);
                                              piVar17 = std::min<int>(piVar17,local_558);
                                              local_169 = 1;
                                              local_28->race = (Skin)*piVar17;
                                              std::__cxx11::string::~string((string *)&local_578);
                                              std::allocator<char>::~allocator(&local_579);
                                            }
                                            else {
                                              bVar6 = std::operator==(set,"guildrank");
                                              if (bVar6) {
                                                pvVar10 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local,1);
                                                local_588[2] = util::to_int(pvVar10);
                                                local_588[1] = 0;
                                                piVar17 = std::max<int>(local_588 + 2,local_588 + 1)
                                                ;
                                                local_588[0] = 9;
                                                piVar17 = std::min<int>(piVar17,local_588);
                                                local_28->guild_rank = (uchar)*piVar17;
                                              }
                                              else {
                                                bVar6 = std::operator==(set,"karma");
                                                if (bVar6) {
                                                  pvVar10 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local,1);
                                                  local_594[2] = util::to_int(pvVar10);
                                                  local_594[1] = 0;
                                                  piVar17 = std::max<int>(local_594 + 2,
                                                                          local_594 + 1);
                                                  local_594[0] = 2000;
                                                  piVar17 = std::min<int>(piVar17,local_594);
                                                  local_16d = 1;
                                                  local_28->karma = *piVar17;
                                                }
                                                else {
                                                  bVar6 = std::operator==(set,"class");
                                                  if (bVar6) {
                                                    pvVar10 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)from_local,1);
                                                  local_5a0[2] = util::to_int(pvVar10);
                                                  local_5a0[1] = 0;
                                                  piVar17 = std::max<int>(local_5a0 + 2,
                                                                          local_5a0 + 1);
                                                  lVar12 = (**(code **)(*(long *)set_local + 0x20))
                                                                     ();
                                                  sVar13 = std::
                                                  vector<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>
                                                  ::size((
                                                  vector<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>
                                                  *)(*(long *)(lVar12 + 0x178) + 8));
                                                  local_5a0[0] = (int)sVar13 + -1;
                                                  piVar17 = std::min<int>(piVar17,local_5a0);
                                                  local_16c = 1;
                                                  local_28->clas = (uchar)*piVar17;
                                                  }
                                                  else {
                                                    local_16a = 1;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        psVar4 = set_local;
        if ((local_16a & 1) == 0) {
          if ((local_169 & 1) != 0) {
            Character::Warp(local_28,local_28->map->id,local_28->x,local_28->y,WARP_ANIMATION_NONE);
          }
          if (((local_16e & 1) != 0) || ((local_16f & 1) != 0)) {
            PacketBuilder::PacketBuilder
                      ((PacketBuilder *)&builder_1.add_size,PACKET_RECOVER,PACKET_TARGET_GROUP,10);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,local_28->statpoints);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,local_28->skillpoints);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,local_28->maxhp);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,local_28->maxtp);
            PacketBuilder::AddShort((PacketBuilder *)&builder_1.add_size,local_28->maxsp);
            Character::Send(local_28,(PacketBuilder *)&builder_1.add_size);
            PacketBuilder::~PacketBuilder((PacketBuilder *)&builder_1.add_size);
          }
          if (((local_16b & 1) != 0) || ((local_16c & 1) != 0)) {
            Character::CalculateStats(local_28,true);
            PacketBuilder::PacketBuilder
                      ((PacketBuilder *)&builder_2.add_size,PACKET_RECOVER,PACKET_LIST,0x20);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,(uint)local_28->clas);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,*local_28->display_str);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,*local_28->display_intl);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,*local_28->display_wis);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,*local_28->display_agi);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,*local_28->display_con);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,*local_28->display_cha);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,local_28->maxhp);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,local_28->maxtp);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,local_28->maxsp);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,local_28->maxweight);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,local_28->mindam);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,local_28->maxdam);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,local_28->accuracy);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,local_28->evade);
            PacketBuilder::AddShort((PacketBuilder *)&builder_2.add_size,local_28->armor);
            Character::Send(local_28,(PacketBuilder *)&builder_2.add_size);
            PacketBuilder::~PacketBuilder((PacketBuilder *)&builder_2.add_size);
          }
          if (((local_16d & 1) != 0) || ((local_16b & 1) != 0)) {
            PacketBuilder::PacketBuilder((PacketBuilder *)local_678,PACKET_RECOVER,PACKET_REPLY,0xb)
            ;
            PacketBuilder::AddInt((PacketBuilder *)local_678,local_28->exp);
            PacketBuilder::AddShort((PacketBuilder *)local_678,local_28->karma);
            if ((local_16b & 1) == 0) {
              local_bfc = 0;
            }
            else {
              local_bfc = (uint)local_28->level;
            }
            PacketBuilder::AddChar((PacketBuilder *)local_678,local_bfc);
            if ((local_16b & 1) != 0) {
              PacketBuilder::AddShort((PacketBuilder *)local_678,local_28->statpoints);
              PacketBuilder::AddShort((PacketBuilder *)local_678,local_28->skillpoints);
            }
            Character::Send(local_28,(PacketBuilder *)local_678);
            PacketBuilder::~PacketBuilder((PacketBuilder *)local_678);
          }
          Character::CheckQuestRules(local_28);
        }
        else {
          lVar12 = (**(code **)(*(long *)set_local + 0x20))();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5e0,"invalid_setx",
                     (allocator<char> *)((long)&builder.add_size + 7));
          I18N::Format<>(&local_5c0,(I18N *)(lVar12 + 0x490),&local_5e0);
          (**(code **)(*(long *)psVar4 + 0x28))(psVar4,&local_5c0);
          std::__cxx11::string::~string((string *)&local_5c0);
          std::__cxx11::string::~string((string *)&local_5e0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&builder.add_size + 7));
        }
        std::__cxx11::string::~string(local_158);
      }
      else {
        lVar12 = (**(code **)(*(long *)set_local + 0x20))();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"command_access_denied",
                   (allocator<char> *)(title_string.field_2._M_local_buf + 0xf));
        I18N::Format<>(&local_110,(I18N *)(lVar12 + 0x490),&local_130);
        (**(code **)(*(long *)psVar4 + 0x28))(psVar4,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(title_string.field_2._M_local_buf + 0xf));
      }
    }
    else {
      lVar12 = (**(code **)(*(long *)set_local + 0x20))();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"command_access_denied",&local_e9);
      I18N::Format<>(&local_c8,(I18N *)(lVar12 + 0x490),&local_e8);
      (**(code **)(*(long *)psVar4 + 0x28))(psVar4,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
    }
  }
  return;
}

Assistant:

void SetX(const std::vector<std::string>& arguments, Command_Source* from, std::string set)
{
	Character *victim = from->SourceWorld()->GetCharacter(arguments[0]);
	Character *from_character = from->SourceCharacter();

	if (!victim || victim->nowhere)
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("character_not_found"));
	}
	else if (victim->SourceAccess() >= from->SourceAccess() && victim != from_character)
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
	}
	else if (from_character && from_character != victim && !from_character->CanInteractCharMod())
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
	}
	else
	{
		std::string title_string = "";

		for (std::size_t i = 1; i < arguments.size(); ++i)
		{
			title_string += arguments[i];

			if (i < arguments.size() - 1)
				title_string += " ";
		}

		bool appearance = false;
		bool failure = false;
		bool level = false;
		bool stats = false;
		bool karma = false;

		bool statpoints = false;
		bool skillpoints = false;

			 if (set == "level") (level = true, victim->level) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxLevel"]));
		else if (set == "exp") (level = true, victim->exp) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxExp"]));
		else if (set == "str") (stats = true, victim->str) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "int") (stats = true, victim->intl) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "wis") (stats = true, victim->wis) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "agi") (stats = true, victim->agi) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "con") (stats = true, victim->con) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "cha") (stats = true, victim->cha) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxStat"]));
		else if (set == "statpoints") (statpoints = true, victim->statpoints) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxLevel"]) * int(from->SourceWorld()->config["StatPerLevel"]));
		else if (set == "skillpoints") (skillpoints = true, victim->skillpoints) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxLevel"]) * int(from->SourceWorld()->config["SkillPerLevel"]));
		else if (set == "admin")
		{
			int no_interact_default_admin = victim->world->config["NoInteractDefaultAdmin"];
			int no_interact_default = victim->world->config["NoInteractDefault"];
			int hide_level = victim->world->admin_config["hide"];

			AdminLevel level = std::min(std::max(AdminLevel(util::to_int(arguments[1])), ADMIN_PLAYER), ADMIN_HGM);

			// Avoid granting a player more privilege by lowering their admin level
			bool would_privilege = (no_interact_default != 0) && (victim->admin >= no_interact_default_admin)
			                    && (level < no_interact_default_admin) && !(victim->nointeract & Character::NoInteractCustom);

			if (level < from->SourceAccess() && victim != from->SourceCharacter() && !would_privilege)
			{
				if (victim->admin < no_interact_default_admin && level >= no_interact_default_admin
				 && !(victim->nointeract & Character::NoInteractCustom))
				{
					victim->nointeract = no_interact_default;
				}

				if (victim->admin >= hide_level && level < hide_level)
					victim->Unhide(Character::HideAll);

				if (level == ADMIN_PLAYER && victim->admin != ADMIN_PLAYER)
					victim->world->DecAdminCount();
				else if (level != ADMIN_PLAYER && victim->admin == ADMIN_PLAYER)
					victim->world->IncAdminCount();

				victim->admin = level;
			}
			else
			{
				from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
			}
		}
		else if (set == "title") victim->title = title_string;
		else if (set == "fiance") victim->fiance = (arguments.size() > 1) ? arguments[1] : "";
		else if (set == "partner") victim->partner = (arguments.size() > 1) ? arguments[1] : "";
		else if (set == "home") victim->home = (arguments.size() > 1) ? arguments[1] : "";
		else if (set == "gender") (appearance = true, victim->gender) = Gender(std::min(std::max(util::to_int(arguments[1]), 0), 1));
		else if (set == "hairstyle") (appearance = true, victim->hairstyle) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxHairStyle"]));
		else if (set == "haircolor") (appearance = true, victim->haircolor) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxHairColor"]));
		else if (set == "race") (appearance = true, victim->race) = Skin(std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->config["MaxSkin"])));
		else if (set == "guildrank") victim->guild_rank = std::min(std::max(util::to_int(arguments[1]), 0), 9);
		else if (set == "karma") (karma = true, victim->karma) = std::min(std::max(util::to_int(arguments[1]), 0), 2000);
		else if (set == "class") (stats = true, victim->clas) = std::min(std::max(util::to_int(arguments[1]), 0), int(from->SourceWorld()->ecf->data.size() - 1));
		else failure = true;

		if (failure)
		{
			from->ServerMsg(from->SourceWorld()->i18n.Format("invalid_setx"));
		}
		else
		{
			// Easiest way to get the character to update on everyone nearby's screen
			if (appearance)
				victim->Warp(victim->map->id, victim->x, victim->y);

			if (statpoints || skillpoints)
			{
				PacketBuilder builder(PACKET_RECOVER, PACKET_TARGET_GROUP, 10);
				builder.AddShort(victim->statpoints);
				builder.AddShort(victim->skillpoints);
				builder.AddShort(victim->maxhp);
				builder.AddShort(victim->maxtp);
				builder.AddShort(victim->maxsp);
				victim->Send(builder);
			}

			if (level || stats)
			{
				victim->CalculateStats();

				PacketBuilder builder(PACKET_RECOVER, PACKET_LIST, 32);
				builder.AddShort(victim->clas);
				builder.AddShort(victim->display_str);
				builder.AddShort(victim->display_intl);
				builder.AddShort(victim->display_wis);
				builder.AddShort(victim->display_agi);
				builder.AddShort(victim->display_con);
				builder.AddShort(victim->display_cha);
				builder.AddShort(victim->maxhp);
				builder.AddShort(victim->maxtp);
				builder.AddShort(victim->maxsp);
				builder.AddShort(victim->maxweight);
				builder.AddShort(victim->mindam);
				builder.AddShort(victim->maxdam);
				builder.AddShort(victim->accuracy);
				builder.AddShort(victim->evade);
				builder.AddShort(victim->armor);
				victim->Send(builder);
			}

			if (karma || level)
			{
				PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 11);
				builder.AddInt(victim->exp);
				builder.AddShort(victim->karma);
				builder.AddChar(level ? victim->level : 0);
				if (level)
				{
					builder.AddShort(victim->statpoints);
					builder.AddShort(victim->skillpoints);
				}
				victim->Send(builder);
			}

			victim->CheckQuestRules();
		}
	}
}